

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O2

void find_bridges_and_articulations(void)

{
  pointer piVar1;
  int iVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  int j;
  ulong uVar5;
  int i;
  size_type __n;
  key_type *__k;
  reference rVar6;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_45;
  int cur;
  key_type *local_40;
  int *local_38;
  
  freopen("bridges_and_articulations.txt","w",_stdout);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::used,(long)V,false);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::tin,(long)V);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::fout,(long)V);
  for (__n = 0; (long)__n < (long)V; __n = __n + 1) {
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::used,__n);
    if ((*rVar6._M_p & rVar6._M_mask) == 0) {
      dfs((int)__n,-1);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Bridges:");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_40 = DAT_0011f1e8;
  for (__k = (anonymous_namespace)::bridges; __k != local_40; __k = __k + 2) {
    pmVar4 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,__k);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
    poVar3 = std::operator<<(poVar3," (");
    iVar2 = count_from(*__k,__k[1],true);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") - ");
    pmVar4 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,__k + 1);
    poVar3 = std::operator<<(poVar3,(string *)pmVar4);
    poVar3 = std::operator<<(poVar3," (");
    iVar2 = count_from(__k[1],*__k,true);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,")\n");
  }
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<(poVar3,"Articulation points:");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_38 = DAT_0011f1d0;
  for (local_40 = (anonymous_namespace)::articulations; local_40 != local_38;
      local_40 = local_40 + 1) {
    cur = *local_40;
    pmVar4 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,&cur);
    std::operator<<((ostream *)&std::cout,(string *)pmVar4);
    local_45 = false;
    __first.super__Bit_iterator_base._8_8_ = 0;
    __first.super__Bit_iterator_base._M_p = (_Bit_type *)(anonymous_namespace)::usedcnt;
    __last.super__Bit_iterator_base._M_offset = DAT_0011f188;
    __last.super__Bit_iterator_base._M_p = (_Bit_type *)DAT_0011f180;
    __last.super__Bit_iterator_base._12_4_ = 0;
    std::__fill_a1(__first,__last,&local_45);
    for (uVar5 = 0;
        piVar1 = edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[cur].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
        uVar5 < (ulong)((long)edge.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[cur].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar5 = uVar5 + 1) {
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedcnt,
                         (long)piVar1[uVar5]);
      if ((*rVar6._M_p & rVar6._M_mask) == 0) {
        iVar2 = count_from(edge.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[cur].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar5],cur,false);
        poVar3 = std::operator<<((ostream *)&std::cout," (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        std::operator<<(poVar3,")");
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void find_bridges_and_articulations() {
    freopen("bridges_and_articulations.txt", "w", stdout); // output file

    used.resize(V, false);
    tin.resize(V);
    fout.resize(V);

    for (int i = 0; i < V; i++)
        if (!used[i])
            dfs(i);
    
    cout << "Bridges:" << endl;
    for (const auto& bridge : bridges) {
        cout << name[bridge.first]
             << " (" << count_from(bridge.first, bridge.second)
             << ") - " << name[bridge.second]
             << " (" << count_from(bridge.second, bridge.first)
             << ")\n";
    }
    
    
    cout << endl << "Articulation points:" << endl;  
    for (int cur : articulations) {
        cout << name[cur];
        
        fill(usedcnt.begin(), usedcnt.end(), false);
            
        for (int j = 0; j < edge[cur].size(); j++) {
            if (!usedcnt[edge[cur][j]]) {
                int comp_size = count_from(edge[cur][j], cur, false); 
                cout << " (" << comp_size << ")";
            }
        }
        cout << endl;
    }
}